

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::VertexBuffersErrorsTest::CheckError
          (VertexBuffersErrorsTest *this,GLenum expected,GLchar *log_message)

{
  GLenum GVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  bool bVar5;
  Enum<int,_2UL> EVar6;
  Enum<int,_2UL> local_1d8 [2];
  MessageBuilder local_1b8;
  GLenum local_34;
  long lStack_30;
  GLenum error;
  Functions *gl;
  GLchar *log_message_local;
  VertexBuffersErrorsTest *pVStack_18;
  GLenum expected_local;
  VertexBuffersErrorsTest *this_local;
  
  gl = (Functions *)log_message;
  log_message_local._4_4_ = expected;
  pVStack_18 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  GVar1 = log_message_local._4_4_;
  lStack_30 = CONCAT44(extraout_var,iVar2);
  local_34 = 0;
  local_34 = (**(code **)(lStack_30 + 0x800))();
  bVar5 = GVar1 == local_34;
  if (!bVar5) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,(char **)&gl);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c7b4d6);
    EVar6 = glu::getErrorStr(local_34);
    local_1d8[0].m_getName = EVar6.m_getName;
    local_1d8[0].m_value = EVar6.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1d8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])" was observed instead.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return bVar5;
}

Assistant:

bool VertexBuffersErrorsTest::CheckError(const glw::GLenum expected, const glw::GLchar* log_message)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum error = 0;

	if (expected != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << log_message << " " << glu::getErrorStr(error)
											<< " was observed instead." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}